

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void upb::generator::WriteMiniTableSource
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,Output *output)

{
  pointer pEVar1;
  pointer pFVar2;
  pointer pMVar3;
  upb_MessageDef *extraout_RDX;
  upb_MessageDef *extraout_RDX_00;
  upb_MessageDef *extraout_RDX_01;
  upb_MessageDef *extraout_RDX_02;
  upb_MessageDef *extraout_RDX_03;
  upb_MessageDef *extraout_RDX_04;
  upb_MessageDef *extraout_RDX_05;
  MessageDefPtr MVar4;
  upb_MessageDef *extraout_RDX_06;
  upb_MessageDef *extraout_RDX_07;
  upb_MessageDef *extraout_RDX_08;
  upb_MessageDef *extraout_RDX_09;
  upb_EnumDef *extraout_RDX_10;
  upb_EnumDef *extraout_RDX_11;
  upb_EnumDef *extraout_RDX_12;
  EnumDefPtr e;
  upb_MessageDef *extraout_RDX_13;
  upb_FieldDef *extraout_RDX_14;
  upb_FieldDef *extraout_RDX_15;
  upb_FieldDef *extraout_RDX_16;
  FieldDefPtr ext;
  upb_FileDef *extraout_RDX_17;
  upb_MessageDef *extraout_RDX_18;
  upb_MessageDef *extraout_RDX_19;
  upb_MessageDef *extraout_RDX_20;
  iterator __end3;
  iterator __begin3;
  pointer pMVar5;
  pointer pEVar6;
  pointer pFVar7;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string_view format_18;
  string_view format_19;
  string_view format_20;
  string_view format_21;
  string_view format_22;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  string local_a0;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> local_80;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> local_68;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> local_50;
  upb_FileDef *local_38;
  
  WriteMiniTableSourceIncludes
            ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)output,output);
  SortedMessages(&local_50,file);
  SortedExtensions(&local_68,file);
  SortedEnums(&local_80,file,kClosedEnums);
  pMVar3 = local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  MVar4.ptr_ = extraout_RDX;
  pMVar5 = local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = file.ptr_;
  if (options->one_output_per_message == true) {
    if (local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      do {
        (anonymous_namespace)::MessagePtrVarName_abi_cxx11_
                  (&local_a0,(_anonymous_namespace_ *)pMVar5->ptr_,MVar4);
        format._M_str = "extern const upb_MiniTable* $0;\n";
        format._M_len = 0x20;
        Output::operator()(output,format,&local_a0);
        MVar4.ptr_ = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          MVar4.ptr_ = extraout_RDX_01;
        }
        pMVar5 = pMVar5 + 1;
      } while (pMVar5 != pMVar3);
    }
    pEVar1 = local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pEVar6 = local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        (anonymous_namespace)::EnumVarName_abi_cxx11_
                  (&local_a0,(_anonymous_namespace_ *)pEVar6->ptr_,(EnumDefPtr)MVar4.ptr_);
        format_00._M_str = "extern const upb_MiniTableEnum $0;\n";
        format_00._M_len = 0x23;
        Output::operator()(output,format_00,&local_a0);
        MVar4.ptr_ = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          MVar4.ptr_ = extraout_RDX_03;
        }
        pEVar6 = pEVar6 + 1;
      } while (pEVar6 != pEVar1);
    }
    pFVar2 = local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pFVar7 = local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        (anonymous_namespace)::ExtensionVarName_abi_cxx11_
                  (&local_a0,(_anonymous_namespace_ *)pFVar7->ptr_,(FieldDefPtr)MVar4.ptr_);
        format_01._M_str = "extern const upb_MiniTableExtension $0;\n";
        format_01._M_len = 0x28;
        Output::operator()(output,format_01,&local_a0);
        MVar4.ptr_ = extraout_RDX_04;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          MVar4.ptr_ = extraout_RDX_05;
        }
        pFVar7 = pFVar7 + 1;
      } while (pFVar7 != pFVar2);
    }
  }
  else {
    for (; pEVar1 = local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
        pEVar6 = local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                 _M_impl.super__Vector_impl_data._M_start, pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
      anon_unknown_5::WriteMessage(pMVar5->ptr_,pools,options,output);
      MVar4.ptr_ = extraout_RDX_18;
    }
    for (; pFVar2 = local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        pFVar7 = local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                 _M_impl.super__Vector_impl_data._M_start, pEVar6 != pEVar1; pEVar6 = pEVar6 + 1) {
      anon_unknown_5::WriteEnum(pEVar6->ptr_,output);
      MVar4.ptr_ = extraout_RDX_19;
    }
    for (; pFVar7 != pFVar2; pFVar7 = pFVar7 + 1) {
      anon_unknown_5::WriteExtension(pools,pFVar7->ptr_,output);
      MVar4.ptr_ = extraout_RDX_20;
    }
  }
  if (local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p =
         (pointer)((long)local_50.
                         super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_50.
                         super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    format_02._M_str = "static const upb_MiniTable *$0[$1] = {\n";
    format_02._M_len = 0x27;
    Output::operator()(output,format_02,(char (*) [16])"messages_layout",(unsigned_long *)&local_a0)
    ;
    pMVar3 = local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      MVar4.ptr_ = extraout_RDX_06;
      pMVar5 = local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        (anonymous_namespace)::MessageVarName_abi_cxx11_
                  (&local_a0,(_anonymous_namespace_ *)pMVar5->ptr_,MVar4);
        format_03._M_str = "  &$0,\n";
        format_03._M_len = 7;
        Output::operator()(output,format_03,&local_a0);
        MVar4.ptr_ = extraout_RDX_07;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          MVar4.ptr_ = extraout_RDX_08;
        }
        pMVar5 = pMVar5 + 1;
      } while (pMVar5 != pMVar3);
    }
    format_04._M_str = "};\n";
    format_04._M_len = 3;
    Output::operator()<>(output,format_04);
    format_05._M_str = "\n";
    format_05._M_len = 1;
    Output::operator()<>(output,format_05);
    MVar4.ptr_ = extraout_RDX_09;
  }
  if (local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p =
         (pointer)((long)local_80.
                         super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.
                         super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3);
    format_06._M_str = "static const upb_MiniTableEnum *$0[$1] = {\n";
    format_06._M_len = 0x2b;
    Output::operator()(output,format_06,(char (*) [13])"enums_layout",(unsigned_long *)&local_a0);
    pEVar1 = local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      e.ptr_ = extraout_RDX_10;
      pEVar6 = local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        (anonymous_namespace)::EnumVarName_abi_cxx11_
                  (&local_a0,(_anonymous_namespace_ *)pEVar6->ptr_,e);
        format_07._M_str = "  &$0,\n";
        format_07._M_len = 7;
        Output::operator()(output,format_07,&local_a0);
        e.ptr_ = extraout_RDX_11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          e.ptr_ = extraout_RDX_12;
        }
        pEVar6 = pEVar6 + 1;
      } while (pEVar6 != pEVar1);
    }
    format_08._M_str = "};\n";
    format_08._M_len = 3;
    Output::operator()<>(output,format_08);
    format_09._M_str = "\n";
    format_09._M_len = 1;
    Output::operator()<>(output,format_09);
    MVar4.ptr_ = extraout_RDX_13;
  }
  if (local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p =
         (pointer)((long)local_68.
                         super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_68.
                         super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3);
    format_10._M_str = "\nstatic const upb_MiniTableExtension *$0[$1] = {\n";
    format_10._M_len = 0x31;
    Output::operator()(output,format_10,(char (*) [18])"extensions_layout",
                       (unsigned_long *)&local_a0);
    pFVar2 = local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ext.ptr_ = extraout_RDX_14;
      pFVar7 = local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        (anonymous_namespace)::ExtensionVarName_abi_cxx11_
                  (&local_a0,(_anonymous_namespace_ *)pFVar7->ptr_,ext);
        format_11._M_str = "  &$0,\n";
        format_11._M_len = 7;
        Output::operator()(output,format_11,&local_a0);
        ext.ptr_ = extraout_RDX_15;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          ext.ptr_ = extraout_RDX_16;
        }
        pFVar7 = pFVar7 + 1;
      } while (pFVar7 != pFVar2);
    }
    format_12._M_str = "};\n\n";
    format_12._M_len = 4;
    Output::operator()<>(output,format_12);
    MVar4.ptr_ = (upb_MessageDef *)extraout_RDX_17;
  }
  (anonymous_namespace)::FileVarName_abi_cxx11_
            (&local_a0,(_anonymous_namespace_ *)local_38,(FileDefPtr)MVar4.ptr_);
  format_13._M_str = "const upb_MiniTableFile $0 = {\n";
  format_13._M_len = 0x1f;
  Output::operator()(output,format_13,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = "messages_layout";
  if (local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p = "NULL";
  }
  format_14._M_str = "  $0,\n";
  format_14._M_len = 6;
  Output::operator()(output,format_14,(char **)&local_a0);
  local_a0._M_dataplus._M_p = "enums_layout";
  if (local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p = "NULL";
  }
  format_15._M_str = "  $0,\n";
  format_15._M_len = 6;
  Output::operator()(output,format_15,(char **)&local_a0);
  local_a0._M_dataplus._M_p = "extensions_layout";
  if (local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p = "NULL";
  }
  format_16._M_str = "  $0,\n";
  format_16._M_len = 6;
  Output::operator()(output,format_16,(char **)&local_a0);
  local_a0._M_dataplus._M_p =
       (pointer)((long)local_50.
                       super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_50.
                       super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  format_17._M_str = "  $0,\n";
  format_17._M_len = 6;
  Output::operator()(output,format_17,(unsigned_long *)&local_a0);
  local_a0._M_dataplus._M_p =
       (pointer)((long)local_80.
                       super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_80.
                       super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
  format_18._M_str = "  $0,\n";
  format_18._M_len = 6;
  Output::operator()(output,format_18,(unsigned_long *)&local_a0);
  local_a0._M_dataplus._M_p =
       (pointer)((long)local_68.
                       super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68.
                       super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  format_19._M_str = "  $0,\n";
  format_19._M_len = 6;
  Output::operator()(output,format_19,(unsigned_long *)&local_a0);
  format_20._M_str = "};\n\n";
  format_20._M_len = 4;
  Output::operator()<>(output,format_20);
  format_21._M_str = "#include \"upb/port/undef.inc\"\n";
  format_21._M_len = 0x1e;
  Output::operator()<>(output,format_21);
  format_22._M_str = "\n";
  format_22._M_len = 1;
  Output::operator()<>(output,format_22);
  if (local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteMiniTableSource(const DefPoolPair& pools, upb::FileDefPtr file,
                          const MiniTableOptions& options, Output& output) {
  WriteMiniTableSourceIncludes(file, options, output);

  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);

  if (options.one_output_per_message) {
    for (auto message : messages) {
      output("extern const upb_MiniTable* $0;\n", MessagePtrVarName(message));
    }
    for (const auto e : enums) {
      output("extern const upb_MiniTableEnum $0;\n", EnumVarName(e));
    }
    for (const auto ext : extensions) {
      output("extern const upb_MiniTableExtension $0;\n",
             ExtensionVarName(ext));
    }
  } else {
    for (auto message : messages) {
      WriteMessage(message, pools, options, output);
    }
    for (const auto e : enums) {
      WriteEnum(e, output);
    }
    for (const auto ext : extensions) {
      WriteExtension(pools, ext, output);
    }
  }

  // Messages.
  if (!messages.empty()) {
    output("static const upb_MiniTable *$0[$1] = {\n", kMessagesInit,
           messages.size());
    for (auto message : messages) {
      output("  &$0,\n", MessageVarName(message));
    }
    output("};\n");
    output("\n");
  }

  // Enums.
  if (!enums.empty()) {
    output("static const upb_MiniTableEnum *$0[$1] = {\n", kEnumsInit,
           enums.size());
    for (const auto e : enums) {
      output("  &$0,\n", EnumVarName(e));
    }
    output("};\n");
    output("\n");
  }

  if (!extensions.empty()) {
    // Extensions.
    output(
        "\n"
        "static const upb_MiniTableExtension *$0[$1] = {\n",
        kExtensionsInit, extensions.size());

    for (auto ext : extensions) {
      output("  &$0,\n", ExtensionVarName(ext));
    }

    output(
        "};\n"
        "\n");
  }

  output("const upb_MiniTableFile $0 = {\n", FileVarName(file));
  output("  $0,\n", messages.empty() ? "NULL" : kMessagesInit);
  output("  $0,\n", enums.empty() ? "NULL" : kEnumsInit);
  output("  $0,\n", extensions.empty() ? "NULL" : kExtensionsInit);
  output("  $0,\n", messages.size());
  output("  $0,\n", enums.size());
  output("  $0,\n", extensions.size());
  output("};\n\n");

  output("#include \"upb/port/undef.inc\"\n");
  output("\n");
}